

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

ec_curve * ec_curve25519(void)

{
  mp_int *p;
  mp_int *a;
  mp_int *b;
  mp_int *G_x;
  
  if (ec_curve25519_initialised == '\0') {
    p = mp_from_hex("7fffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffed");
    a = mp_from_hex("0000000000000000000000000000000000000000000000000000000000076d06");
    b = mp_from_hex("0000000000000000000000000000000000000000000000000000000000000001");
    G_x = mp_from_hex("0000000000000000000000000000000000000000000000000000000000000009");
    initialise_mcurve(&ec_curve25519::curve,p,a,b,G_x,3);
    mp_free(p);
    mp_free(a);
    mp_free(b);
    mp_free(G_x);
    ec_curve25519::curve.name = (char *)0x0;
    ec_curve25519::curve.textname = "Curve25519";
    ec_curve25519_initialised = '\x01';
  }
  return &ec_curve25519::curve;
}

Assistant:

static struct ec_curve *ec_curve25519(void)
{
    static struct ec_curve curve = { 0 };
    static bool initialised = false;

    if (!initialised)
    {
        mp_int *p = MP_LITERAL(0x7fffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffed);
        mp_int *a = MP_LITERAL(0x0000000000000000000000000000000000000000000000000000000000076d06);
        mp_int *b = MP_LITERAL(0x0000000000000000000000000000000000000000000000000000000000000001);
        mp_int *G_x = MP_LITERAL(0x0000000000000000000000000000000000000000000000000000000000000009);
        initialise_mcurve(&curve, p, a, b, G_x, 3);
        mp_free(p);
        mp_free(a);
        mp_free(b);
        mp_free(G_x);

        /* This curve doesn't need a name, because it's never used in
         * any format that embeds the curve name */
        curve.name = NULL;
        curve.textname = "Curve25519";

        /* Now initialised, no need to do it again */
        initialised = true;
    }

    return &curve;
}